

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

StatementSyntax * __thiscall
slang::parsing::Parser::parseVoidCallStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token voidKeyword;
  VoidCastedCallStatementSyntax *pVVar1;
  Info *in_RDI;
  Token semi_00;
  Token closeParen_00;
  Token openParen_00;
  Token apostrophe_00;
  Token semi;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  Token apostrophe;
  Token keyword;
  Parser *in_stack_fffffffffffffe90;
  pointer in_stack_fffffffffffffe98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffea0;
  ParserBase *in_stack_fffffffffffffeb0;
  TokenKind in_stack_ffffffffffffff1e;
  ParserBase *in_stack_ffffffffffffff20;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_58;
  
  ParserBase::consume(in_stack_fffffffffffffeb0);
  semi_00 = ParserBase::expect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  closeParen_00 = ParserBase::expect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  parseExpression(in_stack_fffffffffffffe90);
  openParen_00 = ParserBase::expect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  apostrophe_00 = ParserBase::expect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  elements._M_extent._M_extent_value = in_stack_fffffffffffffea0._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffe98;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe90,
             elements);
  local_58 = closeParen_00.info;
  local_78 = openParen_00._0_8_;
  local_70 = (NamedLabelSyntax *)openParen_00.info;
  local_88 = apostrophe_00._0_8_;
  local_80 = apostrophe_00.info;
  voidKeyword.info = in_RDI;
  voidKeyword._0_8_ = local_80;
  pVVar1 = slang::syntax::SyntaxFactory::voidCastedCallStatement
                     (local_88,local_70,local_78,voidKeyword,apostrophe_00,openParen_00,
                      (ExpressionSyntax *)local_58,closeParen_00,semi_00);
  return &pVVar1->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseVoidCallStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto apostrophe = expect(TokenKind::Apostrophe);
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto semi = expect(TokenKind::Semicolon);
    return factory.voidCastedCallStatement(label, attributes, keyword, apostrophe, openParen, expr,
                                           closeParen, semi);
}